

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type_fracdigits
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint8_t *fracdig,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_68;
  lysp_stmt *plStack_58;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  unsigned_long_long num;
  char *pcStack_38;
  int arg_len;
  char *ptr;
  lysp_ext_instance **exts_local;
  uint8_t *fracdig_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ptr = (char *)exts;
  exts_local = (lysp_ext_instance **)fracdig;
  fracdig_local = (uint8_t *)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if (*fracdig == '\0') {
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar2 = strlen(*(char **)(fracdig_local + 8));
      if ((((int)sVar2 == 0) || (**(char **)(fracdig_local + 8) == '0')) ||
         (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)**(char **)(fracdig_local + 8)] & 0x800) == 0)
         ) {
        if (stmt_local == (lysp_stmt *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(stmt_local[1].stmt + 8) +
                        (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
        }
        ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                sVar2 & 0xffffffff,*(undefined8 *)(fracdig_local + 8),"fraction-digits");
        ctx_local._4_4_ = LY_EVALID;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtoull(*(char **)(fracdig_local + 8),&stack0xffffffffffffffc8,10);
        if ((long)pcStack_38 - *(long *)(fracdig_local + 8) == (long)(int)sVar2) {
          piVar4 = __errno_location();
          if ((*piVar4 == 0x22) || (0x12 < uVar5)) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_80 = (ly_ctx *)0x0;
            }
            else {
              local_80 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                    sVar2 & 0xffffffff,*(undefined8 *)(fracdig_local + 8),"fraction-digits");
            ctx_local._4_4_ = LY_EVALID;
          }
          else {
            *(char *)exts_local = (char)uVar5;
            for (plStack_58 = *(lysp_stmt **)(fracdig_local + 0x28); plStack_58 != (lysp_stmt *)0x0;
                plStack_58 = plStack_58->next) {
              if (plStack_58->kw != LY_STMT_EXTENSION_INSTANCE) {
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_88 = (ly_ctx *)0x0;
                }
                else {
                  local_88 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                pcVar6 = lyplg_ext_stmt2str(plStack_58->kw);
                ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"fraction-digits");
                return LY_EVALID;
              }
              LVar1 = lysp_stmt_ext((lysp_ctx *)stmt_local,plStack_58,LY_STMT_FRACTION_DIGITS,0,
                                    (lysp_ext_instance **)ptr);
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
            }
            ctx_local._4_4_ = LY_SUCCESS;
          }
        }
        else {
          if (stmt_local == (lysp_stmt *)0x0) {
            local_78 = (ly_ctx *)0x0;
          }
          else {
            local_78 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(stmt_local[1].stmt + 8) +
                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  sVar2 & 0xffffffff,*(undefined8 *)(fracdig_local + 8),"fraction-digits");
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_68 = (ly_ctx *)0x0;
    }
    else {
      local_68 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","fraction-digits");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_type_fracdigits(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint8_t *fracdig,
        struct lysp_ext_instance **exts)
{
    char *ptr;
    int arg_len;
    unsigned long long num;

    if (*fracdig) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "fraction-digits");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if (!arg_len || (stmt->arg[0] == '0') || !isdigit(stmt->arg[0])) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }

    errno = 0;
    num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }
    if ((errno == ERANGE) || (num > LY_TYPE_DEC64_FD_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }
    *fracdig = num;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_FRACTION_DIGITS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "fraction-digits");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}